

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void field(LexState *ls,expdesc *v)

{
  Token *pTVar1;
  FuncState *fs;
  SemInfo SVar2;
  undefined4 uVar3;
  int iVar4;
  TValue *i_o;
  expdesc key;
  Value local_38;
  int local_30;
  undefined8 local_28;
  
  fs = ls->fs;
  luaK_exp2anyreg(fs,v);
  iVar4 = (ls->lookahead).token;
  ls->lastline = ls->linenumber;
  if (iVar4 == 0x11f) {
    iVar4 = llex(ls,&(ls->t).seminfo);
    (ls->t).token = iVar4;
  }
  else {
    pTVar1 = &ls->lookahead;
    uVar3 = *(undefined4 *)&pTVar1->field_0x4;
    SVar2 = (ls->lookahead).seminfo;
    (ls->t).token = pTVar1->token;
    *(undefined4 *)&(ls->t).field_0x4 = uVar3;
    (ls->t).seminfo = SVar2;
    pTVar1->token = 0x11f;
  }
  local_38.gc = (GCObject *)str_checkname(ls);
  local_30 = 4;
  local_30 = addk(ls->fs,(TValue *)&local_38,(TValue *)&local_38);
  local_28 = 0xffffffffffffffff;
  local_38.b = 4;
  iVar4 = luaK_exp2RK(fs,(expdesc *)&local_38);
  (v->u).s.aux = iVar4;
  v->k = VINDEXED;
  return;
}

Assistant:

static void field(LexState*ls,expdesc*v){
FuncState*fs=ls->fs;
expdesc key;
luaK_exp2anyreg(fs,v);
luaX_next(ls);
checkname(ls,&key);
luaK_indexed(fs,v,&key);
}